

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var3;
  LogMessage *other;
  long *plVar4;
  Descriptor *pDVar5;
  long lVar6;
  long lVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 4)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(pDVar5 + 0x28);
      if ((((*(byte *)(lVar1 + 1 + lVar7) & 0x10) == 0) ||
          (lVar2 = *(long *)(lVar1 + 0x28 + lVar7), lVar2 == 0)) ||
         ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))) {
        if (*(Descriptor **)(lVar1 + 0x20 + lVar7) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (field->containing_type()) == (descriptor_): "
                            );
          internal::LogFinisher::operator=(&local_69,other);
          internal::LogMessage::~LogMessage(&local_68);
        }
        if ((*(byte *)(lVar1 + 1 + lVar7) & 8) == 0) {
          plVar4 = (long *)(*(long *)(lVar1 + 0x20 + lVar7) + 0x28);
        }
        else {
          lVar2 = *(long *)(lVar1 + 0x28 + lVar7);
          if (lVar2 == 0) {
            plVar4 = (long *)(*(long *)(lVar1 + 0x10 + lVar7) + 0x70);
          }
          else {
            plVar4 = (long *)(lVar2 + 0x50);
          }
        }
        _Var3._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
        _M_head_impl = (this->field_generators_).field_generators_.
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((lVar1 - *plVar4) + lVar7) >> 3) * 0x38e38e39]._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                       ._M_t;
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                              ._M_head_impl + 0x38))
                  (_Var3._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                   ._M_head_impl,printer);
        pDVar5 = (this->super_MessageGenerator).descriptor_;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x48;
    } while (lVar6 < *(int *)(pDVar5 + 4));
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!IsRealOneof(descriptor_->field(i))) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}